

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O0

void __thiscall
ami_nvar_t::ami_nvar_t(ami_nvar_t *this,kstream *p__io,kstruct *p__parent,ami_nvar_t *p__root)

{
  ami_nvar_t *p__root_local;
  kstruct *p__parent_local;
  kstream *p__io_local;
  ami_nvar_t *this_local;
  
  kaitai::kstruct::kstruct(&this->super_kstruct,p__io);
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__ami_nvar_t_0037a7f8;
  std::
  unique_ptr<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>,std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>>>,std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>,std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>,std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>,std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>>>,std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>,std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>>>>>
              *)&this->m_entries);
  this->m__parent = p__parent;
  this->m__root = this;
  std::
  unique_ptr<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>_>_>
  ::operator=(&this->m_entries,(nullptr_t)0x0);
  _read(this);
  return;
}

Assistant:

ami_nvar_t::ami_nvar_t(kaitai::kstream* p__io, kaitai::kstruct* p__parent, ami_nvar_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = this; (void)p__root;
    m_entries = nullptr;
    _read();
}